

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execSwap<(moira::Instr)123,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  uint uVar1;
  u32 uVar2;
  
  uVar1 = *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = uVar1 << 0x10 | uVar1 >> 0x10;
  (this->reg).sr.n = (bool)((byte)(uVar1 >> 8) >> 7);
  (this->reg).sr.z = uVar1 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  return;
}

Assistant:

void
Moira::execSwap(u16 opcode)
{
    int rg  = ( _____________xxx(opcode) );
    u32 dat = readD(rg);

    prefetch<POLLIPL>();

    dat = (dat >> 16) | (dat & 0xFFFF) << 16;
    writeD(rg, dat);

    reg.sr.n = NBIT<Long>(dat);
    reg.sr.z = ZERO<Long>(dat);
    reg.sr.v = 0;
    reg.sr.c = 0;
}